

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O2

QImage * __thiscall
QRasterBuffer::colorizeBitmap
          (QImage *__return_storage_ptr__,QRasterBuffer *this,QImage *image,QColor *color)

{
  bool bVar1;
  QRgb QVar2;
  QRgb QVar3;
  uint uVar4;
  uchar *puVar5;
  uchar *puVar6;
  ulong uVar7;
  QRgb QVar8;
  QRgb i;
  ulong uVar9;
  long in_FS_OFFSET;
  QSize local_80;
  undefined1 local_78 [16];
  QImageData *local_68;
  undefined1 local_58 [16];
  QImageData *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QImage::convertToFormat_helper((QImage *)local_58,image,Format_MonoLSB,(ImageConversionFlags)0x0);
  local_68 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_80 = QImage::size((QImage *)local_58);
  QImage::QImage((QImage *)local_78,&local_80,Format_ARGB32_Premultiplied);
  bVar1 = QImage::isNull((QImage *)local_58);
  if (!bVar1) {
    bVar1 = QImage::isNull((QImage *)local_78);
    if (!bVar1) {
      QVar2 = QColor::rgba(color);
      QVar3 = qPremultiply(QVar2);
      QVar2 = QImage::height((QImage *)local_58);
      uVar4 = QImage::width((QImage *)local_58);
      uVar9 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar9 = 0;
      }
      if ((int)QVar2 < 1) {
        QVar2 = 0;
      }
      for (i = 0; i != QVar2; i = i + 1) {
        puVar5 = QImage::constScanLine((QImage *)local_58,i);
        puVar6 = QImage::scanLine((QImage *)local_78,i);
        for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
          QVar8 = QVar3;
          if ((puVar5[uVar7 >> 3 & 0x1fffffff] >> ((uint)uVar7 & 7) & 1) == 0) {
            QVar8 = 0;
          }
          *(QRgb *)(puVar6 + uVar7 * 4) = QVar8;
        }
      }
      QImage::QImage(__return_storage_ptr__,(QImage *)local_78);
      goto LAB_00373aad;
    }
  }
  QImage::QImage(__return_storage_ptr__,image);
LAB_00373aad:
  QImage::~QImage((QImage *)local_78);
  QImage::~QImage((QImage *)local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QImage QRasterBuffer::colorizeBitmap(const QImage &image, const QColor &color)
{
    Q_ASSERT(image.depth() == 1);

    const QImage sourceImage = image.convertToFormat(QImage::Format_MonoLSB);
    QImage dest = QImage(sourceImage.size(), QImage::Format_ARGB32_Premultiplied);
    if (sourceImage.isNull() || dest.isNull())
        return image; // we must have run out of memory

    QRgb fg = qPremultiply(color.rgba());
    QRgb bg = 0;

    int height = sourceImage.height();
    int width = sourceImage.width();
    for (int y=0; y<height; ++y) {
        const uchar *source = sourceImage.constScanLine(y);
        QRgb *target = reinterpret_cast<QRgb *>(dest.scanLine(y));
        for (int x=0; x < width; ++x)
            target[x] = (source[x>>3] >> (x&7)) & 1 ? fg : bg;
    }
    return dest;
}